

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_sqrt(sexp ctx,sexp a,sexp_conflict *rem_out)

{
  sexp ctx_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp unaff_retaddr;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp tmpa;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp rem;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp_conflict *f;
  sexp in_stack_ffffffffffffff88;
  sexp ctx_01;
  sexp psVar7;
  sexp in_stack_ffffffffffffff98;
  sexp in_stack_ffffffffffffffa0;
  sexp a_00;
  undefined8 z;
  undefined8 n;
  undefined8 uVar8;
  undefined8 ctx_02;
  undefined8 a_01;
  undefined8 ctx_03;
  undefined8 in_stack_fffffffffffffff8;
  
  memset(&stack0xffffffffffffffc8,0,0x10);
  uVar8 = &DAT_0000043e;
  memset(&stack0xffffffffffffffb0,0,0x10);
  a_00 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffff98,0,0x10);
  psVar7 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffff80,0,0x10);
  if (((in_RSI & 3) != 0) || (((sexp)in_RSI)->tag != 0xc)) {
    psVar7 = sexp_type_exception(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                 (sexp_uint_t)psVar7,in_stack_ffffffffffffff88);
    return psVar7;
  }
  ctx_02 = &stack0xffffffffffffffd8;
  a_01 = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc8;
  z = &stack0xffffffffffffffc0;
  n = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffb0;
  ctx_00 = (sexp)(((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffff98;
  f = (sexp_conflict *)&stack0xffffffffffffff90;
  ctx_01 = (sexp)(((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffff80;
  if ((in_RSI & 1) == 1) {
    auVar1._8_8_ = (long)in_RSI >> 0x3f;
    auVar1._0_8_ = in_RSI & 0xfffffffffffffffe;
    if (-1 < SUB168(auVar1 / SEXT816(2),0)) goto LAB_0012cb31;
  }
  else if ((((in_RSI & 3) != 0) || (((sexp)in_RSI)->tag != 0xc)) ||
          (-1 < (((sexp)in_RSI)->value).flonum_bits[0])) goto LAB_0012cb31;
  psVar7 = sexp_copy_bignum(ctx_00,(sexp)&stack0xffffffffffffffa8,psVar7,(sexp_uint_t)ctx_01);
  in_RSI = psVar7;
  if ((((ulong)psVar7 & 3) == 0) && (psVar7->tag == 0xb)) {
    (psVar7->value).stack.length = (psVar7->value).stack.length ^ 0x8000000000000000;
  }
  else if ((((ulong)psVar7 & 3) == 0) && (psVar7->tag == 0xc)) {
    (psVar7->value).flonum_bits[0] = -(psVar7->value).flonum_bits[0];
  }
  else if (((ulong)psVar7 & 1) == 1) {
    auVar2._8_8_ = (long)psVar7 >> 0x3f;
    auVar2._0_8_ = (ulong)psVar7 & 0xfffffffffffffffe;
    in_RSI = SUB168(auVar2 / SEXT816(2),0) * -2 | 1;
  }
LAB_0012cb31:
  ctx_03 = in_RDI;
  sexp_bignum_to_double(psVar7);
  sexp_make_flonum(ctx_01,(double)f);
  psVar7 = sexp_inexact_sqrt((sexp)ctx_02,(sexp)uVar8,n,(sexp)z);
  if (((((ulong)psVar7 & 3) == 0) && (psVar7->tag == 0xb)) &&
     (1073741824.0 < (psVar7->value).flonum)) {
    iVar6 = 1;
    if ((long)(psVar7->value).flonum < 0) {
      iVar6 = -1;
    }
    iVar5 = 0;
    if (ABS((psVar7->value).flonum) == INFINITY) {
      iVar5 = iVar6;
    }
    if (iVar5 == 0) {
      uVar8 = sexp_double_to_bignum((sexp)in_RDX,(double)psVar7);
    }
    else {
      uVar8 = sexp_bignum_sqrt_estimate((sexp)z,a_00);
    }
    do {
      sexp_mul((sexp)__sexp_gc_preserver4.next,(sexp)__sexp_gc_preserver4.var,unaff_retaddr);
      psVar7 = sexp_sub((sexp)__sexp_gc_preserver3.var,tmpa,(sexp)__sexp_gc_preserver4.next);
      if (((ulong)psVar7 & 1) == 1) {
        auVar3._8_8_ = (long)psVar7 >> 0x3f;
        auVar3._0_8_ = (ulong)psVar7 & 0xfffffffffffffffe;
        if (-1 < SUB168(auVar3 / SEXT816(2),0)) {
LAB_0012ccb3:
          if (((((ulong)psVar7 & 3) != 0) || (psVar7->tag != 0xb)) ||
             (0.0 < (psVar7->value).flonum || (psVar7->value).flonum == 0.0)) {
            sexp_sub((sexp)__sexp_gc_preserver3.var,tmpa,(sexp)__sexp_gc_preserver4.next);
            sexp_quotient((sexp)uVar8,(sexp)a_01,(sexp)ctx_02);
            psVar7 = sexp_compare((sexp)ctx_03,(sexp)in_RSI,(sexp)in_RDX);
            if (((ulong)psVar7 & 1) == 1) {
              auVar4._8_8_ = (long)psVar7 >> 0x3f;
              auVar4._0_8_ = (ulong)psVar7 & 0xfffffffffffffffe;
              if (SUB168(auVar4 / SEXT816(2),0) < 0) goto LAB_0012ce68;
            }
            else if (((((ulong)psVar7 & 3) == 0) && (psVar7->tag == 0xc)) &&
                    ((psVar7->value).flonum_bits[0] < '\0')) goto LAB_0012ce68;
            if (((((ulong)psVar7 & 3) == 0) && (psVar7->tag == 0xb)) &&
               ((psVar7->value).flonum <= 0.0 && (psVar7->value).flonum != 0.0)) goto LAB_0012ce68;
          }
        }
      }
      else if (((((ulong)psVar7 & 3) != 0) || (psVar7->tag != 0xc)) ||
              (-1 < (psVar7->value).flonum_bits[0])) goto LAB_0012ccb3;
      sexp_quotient((sexp)uVar8,(sexp)a_01,(sexp)ctx_02);
      psVar7 = sexp_add(unaff_retaddr,(sexp)in_stack_fffffffffffffff8,(sexp)ctx_03);
      uVar8 = sexp_quotient(psVar7,(sexp)a_01,(sexp)ctx_02);
    } while( true );
  }
  if ((((ulong)psVar7 & 3) == 0) && (psVar7->tag == 0xb)) {
    sexp_double_to_bignum((sexp)in_RDX,(double)psVar7);
    sexp_bignum_normalize((sexp)in_RDI);
  }
  sexp_mul((sexp)__sexp_gc_preserver4.next,(sexp)__sexp_gc_preserver4.var,unaff_retaddr);
  sexp_sub((sexp)__sexp_gc_preserver3.var,tmpa,(sexp)__sexp_gc_preserver4.next);
LAB_0012ce68:
  psVar7 = sexp_bignum_normalize((sexp)in_RDI);
  *(sexp *)in_RDX = psVar7;
  (((sexp)ctx_03)->value).context.saves = (sexp_gc_var_t *)a_01;
  psVar7 = sexp_bignum_normalize((sexp)in_RDI);
  return psVar7;
}

Assistant:

sexp sexp_bignum_sqrt (sexp ctx, sexp a, sexp* rem_out) {
  sexp_gc_var4(res, rem, tmp, tmpa);
  if (! sexp_bignump(a)) return sexp_type_exception(ctx, NULL, SEXP_BIGNUM, a);
  sexp_gc_preserve4(ctx, res, rem, tmp, tmpa);
  /* initial estimate via flonum, ignoring signs */
  if (sexp_exact_negativep(a)) {
    tmpa = sexp_copy_bignum(ctx, NULL, a, 0);
    a = tmpa;
    sexp_negate(a);
  }
  res = sexp_make_flonum(ctx, sexp_bignum_to_double(a));
  res = sexp_inexact_sqrt(ctx, NULL, 1, res);
  if (sexp_flonump(res) &&
      sexp_flonum_value(res) > SEXP_MAX_ACCURATE_FLONUM_SQRT) {
    if (isinf(sexp_flonum_value(res)))
      res = sexp_bignum_sqrt_estimate(ctx, a);
    else
      res = sexp_double_to_bignum(ctx, sexp_flonum_value(res));
  loop:                           /* until 0 <= a - res*res < 2*res + 1 */
    rem = sexp_mul(ctx, res, res);
    tmp = rem = sexp_sub(ctx, a, rem);
    if (!sexp_positivep(tmp)) goto adjust;
    tmp = sexp_sub(ctx, tmp, SEXP_ONE);
    tmp = sexp_quotient(ctx, tmp, SEXP_TWO);
    tmp = sexp_compare(ctx, tmp, res);
    if (sexp_positivep(tmp)) {
    adjust:
      tmp = sexp_quotient(ctx, a, res);
      res = sexp_add(ctx, res, tmp);
      res = sexp_quotient(ctx, res, SEXP_TWO);
      goto loop;
    }
  } else {
    if (sexp_flonump(res))
      res = sexp_bignum_normalize(sexp_double_to_bignum(ctx, sexp_flonum_value(res)));
    tmp = sexp_mul(ctx, res, res);
    rem = sexp_sub(ctx, a, tmp);
  }
  *rem_out = sexp_bignum_normalize(rem);
  sexp_gc_release4(ctx);
  return sexp_bignum_normalize(res);
}